

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SpvBuilder.cpp
# Opt level: O1

void __thiscall spv::Builder::createAndSetNoPredecessorBlock(Builder *this,char *param_1)

{
  Function *pFVar1;
  Block *block;
  pointer *__ptr;
  Id IVar2;
  _Head_base<0UL,_spv::Instruction_*,_false> local_38;
  
  block = (Block *)operator_new(0x90);
  IVar2 = this->uniqueId + 1;
  this->uniqueId = IVar2;
  pFVar1 = this->buildPoint->parent;
  block->_vptr_Block = (_func_int **)&PTR__Block_00b0da78;
  (block->instructions).
  super__Vector_base<std::unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_>,_std::allocator<std::unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (block->instructions).
  super__Vector_base<std::unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_>,_std::allocator<std::unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (block->instructions).
  super__Vector_base<std::unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_>,_std::allocator<std::unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (block->predecessors).super__Vector_base<spv::Block_*,_std::allocator<spv::Block_*>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (block->predecessors).super__Vector_base<spv::Block_*,_std::allocator<spv::Block_*>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (block->predecessors).super__Vector_base<spv::Block_*,_std::allocator<spv::Block_*>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (block->successors).super__Vector_base<spv::Block_*,_std::allocator<spv::Block_*>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (block->successors).super__Vector_base<spv::Block_*,_std::allocator<spv::Block_*>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (block->successors).super__Vector_base<spv::Block_*,_std::allocator<spv::Block_*>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (block->localVariables).
  super__Vector_base<std::unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_>,_std::allocator<std::unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (block->localVariables).
  super__Vector_base<std::unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_>,_std::allocator<std::unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (block->localVariables).
  super__Vector_base<std::unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_>,_std::allocator<std::unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  block->parent = pFVar1;
  (block->currentSourceLoc).super__Optional_base<spv::DebugSourceLocation,_true,_true>._M_payload.
  super__Optional_payload_base<spv::DebugSourceLocation>._M_engaged = false;
  (block->currentDebugScope).super__Optional_base<unsigned_int,_true,_true>._M_payload.
  super__Optional_payload_base<unsigned_int>._M_engaged = false;
  block->unreachable = false;
  local_38._M_head_impl = (Instruction *)operator_new(0x60);
  (local_38._M_head_impl)->_vptr_Instruction = (_func_int **)&PTR__Instruction_00b0d9f8;
  (local_38._M_head_impl)->resultId = IVar2;
  (local_38._M_head_impl)->typeId = 0;
  (local_38._M_head_impl)->opCode = OpLabel;
  ((local_38._M_head_impl)->idOperand).super__Bvector_base<std::allocator<bool>_>._M_impl.
  super__Bvector_impl_data._M_finish.super__Bit_iterator_base._M_p = (_Bit_type *)0x0;
  ((local_38._M_head_impl)->idOperand).super__Bvector_base<std::allocator<bool>_>._M_impl.
  super__Bvector_impl_data._M_finish.super__Bit_iterator_base._M_offset = 0;
  ((local_38._M_head_impl)->operands).
  super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  ((local_38._M_head_impl)->operands).
  super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  ((local_38._M_head_impl)->operands).
  super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  ((local_38._M_head_impl)->idOperand).super__Bvector_base<std::allocator<bool>_>._M_impl.
  super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p = (_Bit_type *)0x0;
  ((local_38._M_head_impl)->idOperand).super__Bvector_base<std::allocator<bool>_>._M_impl.
  super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_offset = 0;
  ((local_38._M_head_impl)->idOperand).super__Bvector_base<std::allocator<bool>_>._M_impl.
  super__Bvector_impl_data._M_end_of_storage = (_Bit_pointer)0x0;
  (local_38._M_head_impl)->block = (Block *)0x0;
  std::
  vector<std::unique_ptr<spv::Instruction,std::default_delete<spv::Instruction>>,std::allocator<std::unique_ptr<spv::Instruction,std::default_delete<spv::Instruction>>>>
  ::emplace_back<std::unique_ptr<spv::Instruction,std::default_delete<spv::Instruction>>>
            ((vector<std::unique_ptr<spv::Instruction,std::default_delete<spv::Instruction>>,std::allocator<std::unique_ptr<spv::Instruction,std::default_delete<spv::Instruction>>>>
              *)&block->instructions,
             (unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_> *)&local_38);
  if (local_38._M_head_impl != (Instruction *)0x0) {
    (*(local_38._M_head_impl)->_vptr_Instruction[1])();
  }
  ((block->instructions).
   super__Vector_base<std::unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_>,_std::allocator<std::unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_>_>_>
   ._M_impl.super__Vector_impl_data._M_finish[-1]._M_t.
   super___uniq_ptr_impl<spv::Instruction,_std::default_delete<spv::Instruction>_>._M_t.
   super__Tuple_impl<0UL,_spv::Instruction_*,_std::default_delete<spv::Instruction>_>.
   super__Head_base<0UL,_spv::Instruction_*,_false>._M_head_impl)->block = block;
  Module::mapInstruction
            (pFVar1->parent,
             (block->instructions).
             super__Vector_base<std::unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_>,_std::allocator<std::unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish[-1]._M_t.
             super___uniq_ptr_impl<spv::Instruction,_std::default_delete<spv::Instruction>_>._M_t.
             super__Tuple_impl<0UL,_spv::Instruction_*,_std::default_delete<spv::Instruction>_>.
             super__Head_base<0UL,_spv::Instruction_*,_false>._M_head_impl);
  block->unreachable = true;
  spv::Function::addBlock(this->buildPoint->parent,block);
  this->buildPoint = block;
  this->dirtyLineTracker = true;
  this->dirtyScopeTracker = true;
  return;
}

Assistant:

void Builder::createAndSetNoPredecessorBlock(const char* /*name*/)
{
    Block* block = new Block(getUniqueId(), buildPoint->getParent());
    block->setUnreachable();
    buildPoint->getParent().addBlock(block);
    setBuildPoint(block);

    // if (name)
    //    addName(block->getId(), name);
}